

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxDomain.cpp
# Opt level: O1

BoxDomain * __thiscall amrex::BoxDomain::rmBox(BoxDomain *this,Box *b)

{
  pointer pBVar1;
  BoxList *this_00;
  bool bVar2;
  pointer this_01;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> tmp;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_78;
  BoxList *local_58;
  BoxList local_50;
  
  local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_01 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar1 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = &this->super_BoxList;
  if (this_01 != pBVar1) {
    do {
      bVar2 = Box::intersects(this_01,b);
      if (bVar2) {
        boxDiff(&local_50,this_01,b);
        std::vector<amrex::Box,std::allocator<amrex::Box>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_78,
                   local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        (this_01->smallend).vect[0] = 1;
        (this_01->smallend).vect[1] = 1;
        (this_01->smallend).vect[2] = 1;
        (this_01->bigend).vect[0] = 0;
        (this_01->bigend).vect[1] = 0;
        *(undefined8 *)((this_01->bigend).vect + 2) = 0;
        if (local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != pBVar1);
  }
  this_00 = local_58;
  BoxList::removeEmpty(local_58);
  BoxList::join(this_00,&local_78);
  if (local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (BoxDomain *)this_00;
}

Assistant:

BoxDomain::BoxDomain ()
    :
    BoxList(IndexType::TheCellType())
{}